

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::RunWorkqOnEmptyString(DFA *this,Workq *oldq,Workq *newq,uint flag)

{
  bool bVar1;
  iterator piVar2;
  int *local_30;
  iterator i;
  uint flag_local;
  Workq *newq_local;
  Workq *oldq_local;
  DFA *this_local;
  
  Workq::clear(newq);
  local_30 = SparseSet::begin(&oldq->super_SparseSet);
  while( true ) {
    piVar2 = SparseSet::end(&oldq->super_SparseSet);
    if (local_30 == piVar2) break;
    bVar1 = Workq::is_mark(oldq,*local_30);
    if (bVar1) {
      AddToQueue(this,newq,-1,flag);
    }
    else {
      AddToQueue(this,newq,*local_30,flag);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void DFA::RunWorkqOnEmptyString(Workq* oldq, Workq* newq, uint flag) {
  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i))
      AddToQueue(newq, Mark, flag);
    else
      AddToQueue(newq, *i, flag);
  }
}